

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_ghost_name(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x20);
  *v = pvVar1;
  pcVar2 = parser_getstr(p,"name");
  pcVar2 = string_make(pcVar2);
  v[1] = pcVar2;
  pvVar1 = mem_zalloc(0x80);
  v[3] = pvVar1;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_ghost_name(struct parser *p) {
	struct ghost *h = parser_priv(p);
	struct ghost *g = mem_zalloc(sizeof *g);
	g->next = h;
	g->name = string_make(parser_getstr(p, "name"));
	g->level = mem_zalloc(sizeof(*(g->level)));
	parser_setpriv(p, g);
	return PARSE_ERROR_NONE;
}